

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)7,QRgba64>
               (QRgba64 *buf1,QRgba64 *buf2,int len,QTextureData *image,int fx,int fy,int fdx,
               int fdy)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  if (fdy == 0) {
    uVar1 = image->height;
    iVar3 = (fy >> 0x10) % (int)uVar1;
    uVar4 = iVar3 >> 0x1f & uVar1;
    uVar8 = uVar4 + iVar3 + 1;
    if (uVar8 == uVar1) {
      uVar8 = 0;
    }
    if (0 < len) {
      puVar2 = image->imageData;
      lVar7 = (long)(int)(uVar4 + iVar3) * image->bytesPerLine;
      lVar12 = (long)(int)uVar8 * image->bytesPerLine;
      uVar1 = image->width;
      lVar10 = 0;
      do {
        iVar3 = (int)(CONCAT44(fx >> 0x1f,fx >> 0x10) % (long)(int)uVar1);
        uVar4 = iVar3 >> 0x1f & uVar1;
        uVar8 = uVar4 + iVar3 + 1;
        if (uVar8 == uVar1) {
          uVar8 = 0;
        }
        lVar11 = (long)(int)(uVar4 + iVar3);
        *(undefined8 *)((long)&buf1->rgba + lVar10) = *(undefined8 *)(puVar2 + lVar11 * 8 + lVar7);
        *(undefined8 *)((long)&buf1[1].rgba + lVar10) =
             *(undefined8 *)(puVar2 + (long)(int)uVar8 * 8 + lVar7);
        *(undefined8 *)((long)&buf2->rgba + lVar10) = *(undefined8 *)(puVar2 + lVar11 * 8 + lVar12);
        *(undefined8 *)((long)&buf2[1].rgba + lVar10) =
             *(undefined8 *)(puVar2 + (long)(int)uVar8 * 8 + lVar12);
        fx = fx + fdx;
        lVar10 = lVar10 + 0x10;
      } while ((ulong)(uint)len << 4 != lVar10);
    }
  }
  else if (0 < len) {
    uVar1 = image->width;
    uVar8 = image->height;
    puVar2 = image->imageData;
    lVar12 = 0;
    do {
      iVar3 = (fx >> 0x10) % (int)uVar1;
      uVar4 = iVar3 >> 0x1f & uVar1;
      uVar13 = uVar4 + iVar3 + 1;
      if (uVar13 == uVar1) {
        uVar13 = 0;
      }
      iVar9 = (int)(CONCAT44(fy >> 0x1f,fy >> 0x10) % (long)(int)uVar8);
      uVar5 = iVar9 >> 0x1f & uVar8;
      uVar6 = uVar5 + iVar9 + 1;
      if (uVar6 == uVar8) {
        uVar6 = 0;
      }
      lVar10 = (long)(int)(uVar5 + iVar9) * image->bytesPerLine;
      lVar7 = (long)(int)uVar6 * image->bytesPerLine;
      lVar11 = (long)(int)(uVar4 + iVar3);
      *(undefined8 *)((long)&buf1->rgba + lVar12) = *(undefined8 *)(puVar2 + lVar11 * 8 + lVar10);
      *(undefined8 *)((long)&buf1[1].rgba + lVar12) =
           *(undefined8 *)(puVar2 + (long)(int)uVar13 * 8 + lVar10);
      *(undefined8 *)((long)&buf2->rgba + lVar12) = *(undefined8 *)(puVar2 + lVar11 * 8 + lVar7);
      *(undefined8 *)((long)&buf2[1].rgba + lVar12) =
           *(undefined8 *)(puVar2 + (long)(int)uVar13 * 8 + lVar7);
      fx = fx + fdx;
      fy = fy + fdy;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uint)len << 4 != lVar12);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_fetcher(T *buf1, T *buf2, const int len, const QTextureData &image,
                                                         int fx, int fy, const int fdx, const int fdy)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp || (layout.bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;
    if (fdy == 0) {
        int y1 = (fy >> 16);
        int y2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);

        int i = 0;
        if (blendType == BlendTransformedBilinear) {
            for (; i < len; ++i) {
                int x1 = (fx >> 16);
                int x2;
                fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
                if (x1 != x2)
                    break;
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = buf1[i * 2 + 1] = fetch1(s1, x1);
                    buf2[i * 2 + 0] = buf2[i * 2 + 1] = fetch1(s2, x1);
                } else {
                    buf1[i * 2 + 0] = buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x1];
                    buf2[i * 2 + 0] = buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x1];
                }
                fx += fdx;
            }
            int fastLen = len;
            if (fdx > 0)
                fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
            else if (fdx < 0)
                fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

            for (; i < fastLen; ++i) {
                int x = (fx >> 16);
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x);
                    buf1[i * 2 + 1] = fetch1(s1, x + 1);
                    buf2[i * 2 + 0] = fetch1(s2, x);
                    buf2[i * 2 + 1] = fetch1(s2, x + 1);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x + 1];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x + 1];
                }
                fx += fdx;
            }
        }

        for (; i < len; ++i) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if constexpr (useFetch) {
                buf1[i * 2 + 0] = fetch1(s1, x1);
                buf1[i * 2 + 1] = fetch1(s1, x2);
                buf2[i * 2 + 0] = fetch1(s2, x1);
                buf2[i * 2 + 1] = fetch1(s2, x2);
            } else {
                buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
            }
            fx += fdx;
        }
    } else {
        int i = 0;
        if (blendType == BlendTransformedBilinear) {
            for (; i < len; ++i) {
                int x1 = (fx >> 16);
                int x2;
                int y1 = (fy >> 16);
                int y2;
                fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
                fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
                if (x1 != x2 && y1 != y2)
                    break;
                const uchar *s1 = image.scanLine(y1);
                const uchar *s2 = image.scanLine(y2);
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x1);
                    buf1[i * 2 + 1] = fetch1(s1, x2);
                    buf2[i * 2 + 0] = fetch1(s2, x1);
                    buf2[i * 2 + 1] = fetch1(s2, x2);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
                }
                fx += fdx;
                fy += fdy;
            }
            int fastLen = len;
            if (fdx > 0)
                fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
            else if (fdx < 0)
                fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
            if (fdy > 0)
                fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
            else if (fdy < 0)
                fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

            for (; i < fastLen; ++i) {
                int x = (fx >> 16);
                int y = (fy >> 16);
                const uchar *s1 = image.scanLine(y);
                const uchar *s2 = s1 + image.bytesPerLine;
                if constexpr (useFetch) {
                    buf1[i * 2 + 0] = fetch1(s1, x);
                    buf1[i * 2 + 1] = fetch1(s1, x + 1);
                    buf2[i * 2 + 0] = fetch1(s2, x);
                    buf2[i * 2 + 1] = fetch1(s2, x + 1);
                } else {
                    buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x];
                    buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x + 1];
                    buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x];
                    buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x + 1];
                }
                fx += fdx;
                fy += fdy;
            }
        }

        for (; i < len; ++i) {
            int x1 = (fx >> 16);
            int x2;
            int y1 = (fy >> 16);
            int y2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uchar *s1 = image.scanLine(y1);
            const uchar *s2 = image.scanLine(y2);
            if constexpr (useFetch) {
                buf1[i * 2 + 0] = fetch1(s1, x1);
                buf1[i * 2 + 1] = fetch1(s1, x2);
                buf2[i * 2 + 0] = fetch1(s2, x1);
                buf2[i * 2 + 1] = fetch1(s2, x2);
            } else {
                buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
                buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
                buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
                buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
            }
            fx += fdx;
            fy += fdy;
        }
    }
}